

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O3

void __thiscall muduo::Logger::Impl::formatTime(Impl *this)

{
  long lVar1;
  long *plVar2;
  uint uVar3;
  int iVar4;
  char **ppcVar5;
  int val;
  long *in_FS_OFFSET;
  time_t seconds;
  Fmt us;
  
  lVar1 = (this->time_).microSecondsSinceEpoch_;
  seconds = lVar1 / 1000000;
  iVar4 = (int)seconds;
  if (seconds != in_FS_OFFSET[-10]) {
    in_FS_OFFSET[-10] = seconds;
    if (g_logTimeZone == 0) {
      gmtime_r(&seconds,(tm *)&us);
    }
    else {
      TimeZone::toLocalTime((tm *)&us,(TimeZone *)&g_logTimeZone,seconds);
    }
    snprintf((char *)(*in_FS_OFFSET + -0x90),0x40,"%4d%02d%02d %02d:%02d:%02d",
             (ulong)(us.buf_._20_4_ + 0x76c),(ulong)(us.buf_._16_4_ + 1),(ulong)(uint)us.buf_._12_4_
             ,(ulong)(uint)us.buf_._8_4_,(ulong)(uint)us.buf_._4_4_,(ulong)(uint)us.buf_._0_4_);
  }
  val = (int)lVar1 + iVar4 * -1000000;
  ppcVar5 = &(this->stream_).buffer_.cur_;
  iVar4 = (int)ppcVar5;
  if (g_logTimeZone == 0) {
    Fmt::Fmt<int>(&us,".%06dZ ",val);
    plVar2 = (long *)*ppcVar5;
    uVar3 = iVar4 - (int)plVar2;
    if (0x11 < uVar3) {
      *(char *)(plVar2 + 2) = (char)in_FS_OFFSET[-0x10];
      lVar1 = in_FS_OFFSET[-0x11];
      *plVar2 = in_FS_OFFSET[-0x12];
      plVar2[1] = lVar1;
      plVar2 = (long *)(*ppcVar5 + 0x11);
      *ppcVar5 = (char *)plVar2;
      uVar3 = iVar4 - (int)plVar2;
    }
    if (9 < uVar3) {
      *(char *)(plVar2 + 1) = us.buf_[8];
      *plVar2 = CONCAT44(us.buf_._4_4_,us.buf_._0_4_);
      *ppcVar5 = *ppcVar5 + 9;
    }
  }
  else {
    Fmt::Fmt<int>(&us,".%06d ",val);
    plVar2 = (long *)*ppcVar5;
    uVar3 = iVar4 - (int)plVar2;
    if (0x11 < uVar3) {
      *(char *)(plVar2 + 2) = (char)in_FS_OFFSET[-0x10];
      lVar1 = in_FS_OFFSET[-0x11];
      *plVar2 = in_FS_OFFSET[-0x12];
      plVar2[1] = lVar1;
      plVar2 = (long *)(*ppcVar5 + 0x11);
      *ppcVar5 = (char *)plVar2;
      uVar3 = iVar4 - (int)plVar2;
    }
    if (8 < uVar3) {
      *plVar2 = CONCAT44(us.buf_._4_4_,us.buf_._0_4_);
      *ppcVar5 = *ppcVar5 + 8;
    }
  }
  return;
}

Assistant:

void Logger::Impl::formatTime()
{
  int64_t microSecondsSinceEpoch = time_.microSecondsSinceEpoch();
  time_t seconds = static_cast<time_t>(microSecondsSinceEpoch / Timestamp::kMicroSecondsPerSecond);
  int microseconds = static_cast<int>(microSecondsSinceEpoch % Timestamp::kMicroSecondsPerSecond);
  if (seconds != t_lastSecond)
  {
    t_lastSecond = seconds;
    struct tm tm_time;
    if (g_logTimeZone.valid())
    {
      tm_time = g_logTimeZone.toLocalTime(seconds);
    }
    else
    {
      ::gmtime_r(&seconds, &tm_time); // FIXME TimeZone::fromUtcTime
    }

    int len = snprintf(t_time, sizeof(t_time), "%4d%02d%02d %02d:%02d:%02d",
        tm_time.tm_year + 1900, tm_time.tm_mon + 1, tm_time.tm_mday,
        tm_time.tm_hour, tm_time.tm_min, tm_time.tm_sec);
    assert(len == 17); (void)len;
  }

  if (g_logTimeZone.valid())
  {
    Fmt us(".%06d ", microseconds);
    assert(us.length() == 8);
    stream_ << T(t_time, 17) << T(us.data(), 8);
  }
  else
  {
    Fmt us(".%06dZ ", microseconds);
    assert(us.length() == 9);
    stream_ << T(t_time, 17) << T(us.data(), 9);
  }
}